

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int nn_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = 0;
  uVar2 = 0;
  uVar6 = 0;
  for (uVar3 = 0; uVar3 < in_len; uVar3 = uVar3 + 1) {
    uVar6 = uVar6 << 8 | (uint)in[uVar3];
    uVar2 = uVar2 + 8;
    while (5 < uVar2) {
      uVar4 = (ulong)uVar5;
      if (out_len <= uVar4) {
        return -0x69;
      }
      uVar2 = uVar2 - 6;
      uVar5 = uVar5 + 1;
      out[uVar4] = (&DAT_001375b0)[uVar6 >> ((byte)uVar2 & 0x1f) & 0x3f];
    }
  }
  if (uVar2 == 0) goto LAB_0012f77a;
  uVar4 = (ulong)uVar5;
  if (uVar4 < out_len) {
    cVar1 = (&DAT_001375b0)[uVar6 << (6U - (char)uVar2 & 0x1f) & 0x3f];
    do {
      uVar5 = uVar5 + 1;
      out[uVar4] = cVar1;
LAB_0012f77a:
      uVar4 = (ulong)uVar5;
      if ((uVar5 & 3) == 0) {
        if (out_len <= uVar4) {
          return -0x69;
        }
        out[uVar4] = '\0';
        return uVar5;
      }
      cVar1 = '=';
    } while (uVar4 < out_len);
  }
  return -0x69;
}

Assistant:

int nn_base64_encode (const uint8_t *in, size_t in_len,
    char *out, size_t out_len)
{
    unsigned ii;
    unsigned io;
    unsigned rem;
    uint32_t v;
    uint8_t ch;

    const uint8_t ENCODEMAP [64] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz"
        "0123456789+/";

    for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
        ch = in [ii];
        v = (v << 8) | ch;
        rem += 8;
        while (rem >= 6) {
            rem -= 6;
            if (io >= out_len)
                return -ENOBUFS;
            out [io++] = ENCODEMAP [(v >> rem) & 63];
        }
    }

    if (rem) {
        v <<= (6 - rem);
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = ENCODEMAP [v & 63];
    }

    /*  Pad to a multiple of 3. */
    while (io & 3) {
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = '=';
    }

    if (io >= out_len)
        return -ENOBUFS;
    
    out [io] = '\0';

    return io;
}